

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

bool __thiscall
helics::PublicationInfo::CheckSetValue
          (PublicationInfo *this,char *dataToCheck,uint64_t len,Time currentTime,
          bool forceChangeCheck)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  byte bVar1;
  bool bVar2;
  baseType in_RCX;
  size_type in_RDX;
  char *in_RSI;
  TimeRepresentation<count_time<9,_long>_> *in_RDI;
  byte in_R8B;
  string_view sVar3;
  undefined1 in_stack_ffffffffffffffa8 [16];
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffb8;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R8B & 1;
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                    (in_RDI + 0x1e,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar2) {
    in_stack_ffffffffffffffc8 =
         TimeRepresentation<count_time<9,_long>_>::operator-(in_stack_ffffffffffffffa8._0_8_,in_RDI)
    ;
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffc8,
                       in_RDI + 0x1e);
    if (bVar2) {
      return false;
    }
  }
  if (((in_RDI[0x1d].internalTimeCode & 0x100) == 0) && ((bVar1 & 1) == 0)) {
    if ((in_RDI[0x1d].internalTimeCode & 0x1000000) != 0) {
      SmallBuffer::assign(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_,
                          (size_t)in_RDI);
    }
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb8,in_RSI,
               in_RDX);
    sVar3 = SmallBuffer::to_string((SmallBuffer *)0x59d501);
    __x._M_str._0_7_ = in_stack_ffffffffffffffd0;
    __x._M_len = in_stack_ffffffffffffffc8.internalTimeCode;
    __x._M_str._7_1_ = bVar1;
    bVar2 = std::operator==(__x,in_stack_ffffffffffffffb8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return false;
    }
    SmallBuffer::assign((SmallBuffer *)sVar3._M_str,(void *)sVar3._M_len,(size_t)in_RDI);
  }
  in_RDI[0x1c].internalTimeCode = in_RCX;
  return true;
}

Assistant:

bool PublicationInfo::CheckSetValue(const char* dataToCheck,
                                    uint64_t len,
                                    Time currentTime,
                                    bool forceChangeCheck)
{
    if (minTimeGap > timeZero) {
        if (currentTime - lastPublishTime < minTimeGap) {
            return false;
        }
    }
    if (only_update_on_change || forceChangeCheck) {
        if (std::string_view(dataToCheck, len) != data.to_string()) {
            data.assign(dataToCheck, len);
        } else {
            return false;
        }
    } else if (buffer_data) {
        data.assign(dataToCheck, len);
    }
    lastPublishTime = currentTime;
    return true;
}